

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaPCustomAttrErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlChar **ownerDes,
               xmlSchemaBasicItemPtr ownerItem,xmlAttrPtr attr,char *msg)

{
  int line;
  xmlChar *des;
  int in_stack_ffffffffffffff90;
  char *pcVar1;
  xmlChar *local_30;
  
  line = (int)msg;
  local_30 = (xmlChar *)0x0;
  xmlSchemaFormatItemForReport
            (&local_30,(xmlChar *)0x0,(xmlSchemaBasicItemPtr)ownerDes[5],(xmlNodePtr)ownerItem);
  if (ownerDes == (xmlChar **)0x0) {
    pcVar1 = "Unknown";
    ownerDes = (xmlChar **)0x0;
  }
  else {
    pcVar1 = (char *)ownerDes[2];
  }
  xmlSchemaPErrFull(ctxt,(xmlNodePtr)ownerDes,error,XML_ERR_ERROR,(char *)attr,line,(xmlChar *)0x0,
                    (xmlChar *)0x0,(xmlChar *)0x0,in_stack_ffffffffffffff90,
                    "%s, attribute \'%s\': %s.\n",local_30,pcVar1,ownerItem,0,0);
  if (local_30 != (xmlChar *)0x0) {
    (*xmlFree)(local_30);
  }
  return;
}

Assistant:

static void
xmlSchemaPCustomAttrErr(xmlSchemaParserCtxtPtr ctxt,
			xmlParserErrors error,
			xmlChar **ownerDes,
			xmlSchemaBasicItemPtr ownerItem,
			xmlAttrPtr attr,
			const char *msg)
{
    xmlChar *des = NULL;

    if (ownerDes == NULL)
	xmlSchemaFormatItemForReport(&des, NULL, ownerItem, attr->parent);
    else if (*ownerDes == NULL) {
	xmlSchemaFormatItemForReport(ownerDes, NULL, ownerItem, attr->parent);
	des = *ownerDes;
    } else
	des = *ownerDes;
    if (attr == NULL) {
	xmlSchemaPErrExt(ctxt, NULL, error, NULL, NULL, NULL,
	    "%s, attribute '%s': %s.\n",
	    BAD_CAST des, (const xmlChar *) "Unknown",
	    (const xmlChar *) msg, NULL, NULL);
    } else {
	xmlSchemaPErrExt(ctxt, (xmlNodePtr) attr, error, NULL, NULL, NULL,
	    "%s, attribute '%s': %s.\n",
	    BAD_CAST des, attr->name, (const xmlChar *) msg, NULL, NULL);
    }
    if (ownerDes == NULL)
	FREE_AND_NULL(des);
}